

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVector.h
# Opt level: O2

bool __thiscall
chrono::ChVector<double>::Equals(ChVector<double> *this,ChVector<double> *other,double tol)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  auVar3._8_8_ = 0x7fffffffffffffff;
  auVar3._0_8_ = 0x7fffffffffffffff;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = other->m_data[0] - this->m_data[0];
  auVar3 = vandpd_avx512vl(auVar4,auVar3);
  if ((auVar3._0_8_ < tol) &&
     (auVar1._8_8_ = 0x7fffffffffffffff, auVar1._0_8_ = 0x7fffffffffffffff, auVar5._8_8_ = 0,
     auVar5._0_8_ = other->m_data[1] - this->m_data[1], auVar3 = vandpd_avx512vl(auVar5,auVar1),
     auVar3._0_8_ < tol)) {
    auVar2._8_8_ = 0x7fffffffffffffff;
    auVar2._0_8_ = 0x7fffffffffffffff;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = other->m_data[2] - this->m_data[2];
    auVar3 = vandpd_avx512vl(auVar6,auVar2);
    return auVar3._0_8_ < tol;
  }
  return false;
}

Assistant:

inline bool ChVector<Real>::Equals(const ChVector<Real>& other, Real tol) const {
    return (std::abs(other.m_data[0] - m_data[0]) < tol) && (std::abs(other.m_data[1] - m_data[1]) < tol) &&
           (std::abs(other.m_data[2] - m_data[2]) < tol);
}